

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  pointer puVar1;
  _Base_ptr p_Var2;
  Column_settings *pCVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 *puVar6;
  _List_node_base *p_Var7;
  undefined4 local_6a4;
  undefined4 *local_6a0;
  _Base_ptr local_698;
  undefined **local_690;
  ulong local_688;
  shared_count sStack_680;
  undefined4 **local_678;
  undefined8 local_670;
  uint local_668 [2];
  undefined8 *local_660;
  _Base_ptr *local_658;
  undefined1 local_650 [8];
  undefined8 local_648;
  shared_count sStack_640;
  char *local_638;
  char *local_630;
  undefined **local_628;
  char *local_620;
  undefined8 *local_618;
  char *local_610;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>
              *)&m.matrix_,&columns,m.colSettings_);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>
            (&columns,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (m.matrix_.super_RU_vine_swap_option.super_type.barcode_.
      super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next !=
      (_List_node_base *)&m.matrix_.super_RU_vine_swap_option.super_type.barcode_) {
    p_Var7 = m.matrix_.super_RU_vine_swap_option.super_type.barcode_.
             super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      __args = p_Var7 + 1;
      __args_1 = (uint *)((long)&p_Var7[1]._M_next + 4);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,(int *)__args,__args_1,(uint *)&p_Var7[1]._M_prev);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,(int *)__args,__args_1,(uint *)&p_Var7[1]._M_prev);
      local_668[0] = *(uint *)&p_Var7[1]._M_prev;
      local_670 = (undefined **)__args->_M_next;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_670,(uint *)((long)&local_670 + 4),local_668);
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)&m.matrix_.super_RU_vine_swap_option.super_type.barcode_);
  }
  p_Var2 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_300,0x574);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_698 = (_Base_ptr)&p_Var2[1]._M_parent;
  local_6a0 = &local_6a4;
  local_6a4 = 0;
  local_650[0] = *(int *)&p_Var2[1]._M_parent == 0;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_658 = &local_698;
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_688 = local_688 & 0xffffffffffffff00;
  local_678 = &local_6a0;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x575);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 0;
  local_650[0] = *(int *)&p_Var2[1].field_0x4 == 0;
  local_698 = (_Base_ptr)&p_Var2[1].field_0x4;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x577);
  local_698 = p_Var2 + 1;
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 0xffffffff;
  local_650[0] = local_698->_M_color == ~_S_red;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_360,0x579);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 0;
  local_650[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_698 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x57a);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 1;
  local_650[0] = *(int *)&p_Var5[1].field_0x4 == 1;
  local_698 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x57b);
  local_698 = p_Var5 + 1;
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 3;
  local_650[0] = local_698->_M_color == 3;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x57d);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 0;
  local_650[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_698 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x57e);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 2;
  local_650[0] = *(int *)&p_Var5[1].field_0x4 == 2;
  local_698 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x57f);
  local_698 = p_Var5 + 1;
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 4;
  local_650[0] = local_698->_M_color == 4;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_420,0x581);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 0;
  local_650[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_698 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0x582);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 7;
  local_650[0] = *(int *)&p_Var5[1].field_0x4 == 7;
  local_698 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x583);
  local_698 = p_Var5 + 1;
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 8;
  local_650[0] = local_698->_M_color == 8;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_480,0x585);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 1;
  local_650[0] = *(int *)&p_Var5[1]._M_parent == 1;
  local_698 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a0,0x586);
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 5;
  local_650[0] = *(int *)&p_Var5[1].field_0x4 == 5;
  local_698 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_640);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0x587);
  local_698 = p_Var5 + 1;
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_628 = &PTR__lazy_ostream_002312f8;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = "";
  local_6a4 = 6;
  local_650[0] = local_698->_M_color == 6;
  local_648 = 0;
  sStack_640.pi_ = (sp_counted_base *)0x0;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_630 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_002312b8;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = &local_698;
  local_6a0 = &local_6a4;
  local_688 = local_688 & 0xffffffffffffff00;
  local_690 = &PTR__lazy_ostream_002312b8;
  sStack_680.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_678 = &local_6a0;
  boost::test_tools::tt_detail::report_assertion
            (local_650,&local_628,&local_638,0x587,1,2,2,"std::get<2>(*it)",&local_670,"6",
             &local_690);
  boost::detail::shared_count::~shared_count(&sStack_640);
  puVar6 = (undefined1 *)std::_Rb_tree_increment(p_Var5);
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4e0,0x589);
  local_690 = (undefined **)
              CONCAT71(local_690._1_7_,
                       (_Rb_tree_header *)puVar6 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_688 = 0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_628 = (undefined **)0x1f05cd;
  local_620 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_00231438;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4f8 = "";
  local_658 = (_Base_ptr *)&local_628;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_510,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_690 = (undefined **)CONCAT71(local_690._1_7_,bVar4);
  local_688 = 0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_628 = (undefined **)0x1f05df;
  local_620 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_00231438;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_528 = "";
  local_658 = (_Base_ptr *)&local_628;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_538 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_540,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_690 = (undefined **)CONCAT71(local_690._1_7_,bVar4);
  local_688 = 0;
  sStack_680.pi_ = (sp_counted_base *)0x0;
  local_628 = (undefined **)0x1f05ee;
  local_620 = "";
  local_668[0] = local_668[0] & 0xffffff00;
  local_670 = &PTR__lazy_ostream_00231438;
  local_660 = &boost::unit_test::lazy_ostream::inst;
  local_658 = (_Base_ptr *)&local_628;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_680);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
  ::reset(&m.matrix_,m.colSettings_);
  pCVar3 = m.colSettings_;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
    operator_delete(pCVar3,0x38);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
  ::~RU_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}